

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O0

GlobRank slang::svGlob(path *basePath,string_view pattern,GlobMode mode,
                      SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool expandEnvVars,
                      error_code *ec)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  ulong uVar4;
  iterator ppVar5;
  int in_ECX;
  char *pcVar6;
  char *in_RDX;
  size_t in_RSI;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_R8;
  byte in_R9B;
  error_code eVar7;
  error_code *in_stack_00000008;
  file_status status;
  path canonical;
  path *p;
  iterator __end1;
  iterator __begin1;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *__range1;
  error_code localEc;
  bool anyWildcards;
  GlobRank rank;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local;
  char c;
  const_pointer end;
  const_pointer ptr;
  string patternStr;
  path patternPath;
  size_t in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  file_type in_stack_fffffffffffffca7;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_stack_fffffffffffffca8;
  SmallVectorBase<std::filesystem::__cxx11::path> *this;
  undefined4 in_stack_fffffffffffffcb0;
  GlobRank in_stack_fffffffffffffcb4;
  size_type in_stack_fffffffffffffcb8;
  path *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  GlobRank in_stack_fffffffffffffccc;
  char *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffce0;
  format fVar8;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  path *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  path *in_stack_fffffffffffffd00;
  undefined4 uStack_2f4;
  undefined4 uStack_2e4;
  undefined4 uStack_2d4;
  undefined8 local_2c8 [9];
  char *in_stack_fffffffffffffd80;
  char **in_stack_fffffffffffffd88;
  iterator local_260;
  error_code local_250;
  __sv_type local_240;
  __sv_type local_208;
  byte local_1cd;
  GlobRank local_1cc;
  SmallVectorBase<std::filesystem::__cxx11::path> local_1c8 [4];
  char local_c1;
  char *local_c0;
  char *local_b8;
  bool *in_stack_ffffffffffffff50;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_stack_ffffffffffffff58;
  GlobMode in_stack_ffffffffffffff64;
  path *in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  path local_80;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  char *local_40;
  byte local_31;
  SmallVectorBase<std::filesystem::__cxx11::path> *local_30;
  int local_24;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  GlobRank local_4;
  
  fVar8 = (format)((ulong)in_stack_fffffffffffffce0 >> 0x38);
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_18._M_len = in_RSI;
  local_18._M_str = in_RDX;
  std::error_code::clear
            ((error_code *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  local_48 = local_18._M_len;
  local_40 = local_18._M_str;
  local_58 = sv((char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                in_stack_fffffffffffffc98);
  __x._M_len._4_4_ = in_stack_fffffffffffffccc;
  __x._M_len._0_4_ = in_stack_fffffffffffffcc8;
  __x._M_str = in_stack_fffffffffffffcd0;
  __y._M_str = (char *)in_stack_fffffffffffffcc0;
  __y._M_len = in_stack_fffffffffffffcb8;
  bVar1 = std::operator==(__x,__y);
  if ((bVar1) && (local_24 == 0)) {
    SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<char_const(&)[2]>
              (in_stack_fffffffffffffca8,
               (char (*) [2])CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    local_4 = ExactPath;
  }
  else {
    std::filesystem::__cxx11::path::path
              ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    if ((local_31 & 1) == 0) {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffcf0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),fVar8);
      std::filesystem::__cxx11::path::operator=
                ((path *)in_stack_fffffffffffffca8,
                 (path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&in_stack_fffffffffffffcc0->_M_pathname,in_stack_fffffffffffffcb8);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
      local_b8 = pvVar2;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      local_c0 = pvVar2 + sVar3;
      while (local_b8 != local_c0) {
        pcVar6 = local_b8 + 1;
        local_c1 = *local_b8;
        local_b8 = pcVar6;
        if ((local_c1 == '$') && (pcVar6 != local_c0)) {
          OS::parseEnvVar_abi_cxx11_(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                     (char)((ulong)in_stack_fffffffffffffca8 >> 0x38));
        }
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffd00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (format)((ulong)in_stack_fffffffffffffcf0 >> 0x38));
      std::filesystem::__cxx11::path::operator=
                ((path *)in_stack_fffffffffffffca8,
                 (path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    }
    std::filesystem::__cxx11::path::lexically_normal();
    std::filesystem::__cxx11::path::operator=
              ((path *)in_stack_fffffffffffffca8,
               (path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
              ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x57f07e);
    local_1cd = 0;
    uVar4 = std::filesystem::__cxx11::path::has_root_path();
    if ((uVar4 & 1) == 0) {
      in_stack_fffffffffffffcc0 = (path *)getU8Str((path *)0x57f1d8);
      local_240 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      in_stack_fffffffffffffcb4 =
           svGlobInternal(in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50);
      local_1cc = in_stack_fffffffffffffcb4;
    }
    else {
      std::filesystem::__cxx11::path::root_path();
      std::filesystem::__cxx11::path::relative_path();
      getU8Str((path *)0x57f0d7);
      local_208 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      in_stack_fffffffffffffccc =
           svGlobInternal(in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50);
      local_1cc = in_stack_fffffffffffffccc;
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    }
    std::error_code::error_code
              ((error_code *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    this = local_30;
    SmallVectorBase<std::filesystem::__cxx11::path>::size(local_1c8);
    SmallVectorBase<std::filesystem::__cxx11::path>::reserve
              ((SmallVectorBase<std::filesystem::__cxx11::path> *)
               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),(size_type)this);
    local_260 = SmallVectorBase<std::filesystem::__cxx11::path>::begin(local_1c8);
    ppVar5 = SmallVectorBase<std::filesystem::__cxx11::path>::end(local_1c8);
    for (; local_260 != ppVar5; local_260 = local_260 + 1) {
      std::filesystem::weakly_canonical((path *)(local_2c8 + 6),(error_code *)local_260);
      bVar1 = std::error_code::operator_cast_to_bool(&local_250);
      if (!bVar1) {
        SmallVectorBase<std::filesystem::__cxx11::path>::
        emplace_back<std::filesystem::__cxx11::path>
                  (this,(path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      }
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    }
    if (((local_1cd & 1) == 0) && (local_1cc == SimpleName)) {
      local_1cc = ExactPath;
      bVar1 = SmallVectorBase<std::filesystem::__cxx11::path>::empty(local_30);
      if (bVar1) {
        uVar4 = std::filesystem::__cxx11::path::has_root_path();
        if ((uVar4 & 1) == 0) {
          std::filesystem::__cxx11::operator/
                    ((path *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc0);
          std::filesystem::__cxx11::path::operator=
                    ((path *)this,
                     (path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
        }
        local_2c8[0] = std::filesystem::status(&local_80,in_stack_00000008);
        bVar1 = std::error_code::operator_cast_to_bool(in_stack_00000008);
        if (!bVar1) {
          in_stack_fffffffffffffca7 = std::filesystem::file_status::type((file_status *)local_2c8);
          if (in_stack_fffffffffffffca7 == not_found) {
            eVar7 = std::make_error_code(0);
            *(ulong *)in_stack_00000008 = CONCAT44(uStack_2e4,eVar7._M_value);
            in_stack_00000008->_M_cat = eVar7._M_cat;
          }
          else if (in_stack_fffffffffffffca7 == directory) {
            eVar7 = std::make_error_code(0);
            *(ulong *)in_stack_00000008 = CONCAT44(uStack_2d4,eVar7._M_value);
            in_stack_00000008->_M_cat = eVar7._M_cat;
          }
          else if (in_stack_fffffffffffffca7 == unknown) {
            eVar7 = std::make_error_code(0);
            *(ulong *)in_stack_00000008 = CONCAT44(uStack_2f4,eVar7._M_value);
            in_stack_00000008->_M_cat = eVar7._M_cat;
          }
          else if (local_24 == 1) {
            eVar7 = std::make_error_code(0);
            *(ulong *)in_stack_00000008 = CONCAT44(in_stack_fffffffffffffcfc,eVar7._M_value);
            in_stack_00000008->_M_cat = eVar7._M_cat;
          }
          else {
            eVar7 = std::make_error_code(0);
            *(ulong *)in_stack_00000008 = CONCAT44(in_stack_fffffffffffffcec,eVar7._M_value);
            in_stack_00000008->_M_cat = eVar7._M_cat;
          }
        }
      }
    }
    local_4 = local_1cc;
    SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
              ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x57f586);
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  }
  return local_4;
}

Assistant:

SLANG_EXPORT GlobRank svGlob(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                             SmallVector<fs::path>& results, bool expandEnvVars,
                             std::error_code& ec) {
    ec.clear();
    if (pattern == "-"sv && mode == GlobMode::Files) {
        // This is interpretted as trying to read stdin.
        results.emplace_back("-");
        return GlobRank::ExactPath;
    }

    fs::path patternPath;
    if (expandEnvVars) {
        std::string patternStr;
        patternStr.reserve(pattern.size());

        auto ptr = pattern.data();
        auto end = ptr + pattern.size();
        while (ptr != end) {
            char c = *ptr++;
            if (c == '$' && ptr != end)
                patternStr.append(OS::parseEnvVar(ptr, end));
            else
                patternStr.push_back(c);
        }

        patternPath = fs::path(patternStr);
    }
    else {
        patternPath = fs::path(pattern);
    }

    // Normalize the path to remove duplicate separators, figure out
    // whether we have an absolute path, etc.
    patternPath = patternPath.lexically_normal();

    SmallVector<fs::path> local;
    GlobRank rank;
    bool anyWildcards = false;
    if (patternPath.has_root_path()) {
        rank = svGlobInternal(patternPath.root_path(), getU8Str(patternPath.relative_path()), mode,
                              local, anyWildcards);
    }
    else {
        rank = svGlobInternal(basePath, getU8Str(patternPath), mode, local, anyWildcards);
    }

    // Results paths are always made canonical.
    std::error_code localEc;
    results.reserve(local.size());
    for (auto& p : local) {
        auto canonical = fs::weakly_canonical(p, localEc);
        if (!localEc)
            results.emplace_back(std::move(canonical));
    }

    if (!anyWildcards && rank == GlobRank::SimpleName) {
        // If there were no wildcards at all and we had a simple name match,
        // promote the rank to an exact path match.
        rank = GlobRank::ExactPath;
        if (results.empty()) {
            if (!patternPath.has_root_path())
                patternPath = basePath / patternPath;

            auto status = fs::status(patternPath, ec);
            if (!ec) {
                switch (status.type()) {
                    case fs::file_type::directory:
                        ec = make_error_code(std::errc::is_a_directory);
                        break;
                    case fs::file_type::not_found:
                        ec = make_error_code(std::errc::no_such_file_or_directory);
                        break;
                    case fs::file_type::unknown:
                        ec = make_error_code(std::errc::permission_denied);
                        break;
                    default:
                        if (mode == GlobMode::Directories)
                            ec = make_error_code(std::errc::not_a_directory);
                        else
                            ec = make_error_code(std::errc::not_supported);
                        break;
                }
            }
        }
    }

    return rank;
}